

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  byte *pbVar1;
  float *pfVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  ImGuiWindow *pIVar6;
  ImVec2 IVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  ImGuiID id;
  ulong uVar11;
  bool bVar12;
  byte bVar13;
  ulong uVar14;
  int iVar15;
  char cVar16;
  long lVar17;
  ImGuiTableColumn *pIVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  ImRect host_clip_rect;
  ImRect local_58;
  ImGuiContext *local_48;
  ImRect local_40;
  
  local_48 = GImGui;
  uVar19 = table->Flags & 0xe000;
  table->IsDefaultDisplayOrder = true;
  table->ColumnsEnabledCount = '\0';
  table->EnabledMaskByDisplayOrder = 0;
  table->EnabledMaskByIndex = 0;
  table->LeftMostEnabledColumn = -1;
  fVar25 = (local_48->Style).FramePadding.x;
  fVar26 = 1.0;
  if (1.0 <= fVar25) {
    fVar26 = fVar25;
  }
  table->MinColumnWidth = fVar26;
  uVar10 = table->ColumnsCount;
  bVar9 = false;
  if ((int)uVar10 < 1) {
    uVar11 = 0xff;
    bVar8 = true;
    fVar25 = 0.0;
    fVar26 = 0.0;
    fVar23 = 0.0;
    cVar16 = '\0';
  }
  else {
    cVar16 = '\0';
    uVar20 = 0;
    iVar15 = 0;
    bVar9 = false;
    bVar8 = false;
    fVar26 = 0.0;
    fVar25 = 0.0;
    uVar14 = 0xffffffff;
    do {
      bVar13 = (table->DisplayOrderToIndex).Data[uVar20];
      uVar11 = (ulong)(uint)(int)(char)bVar13;
      if (uVar20 != uVar11) {
        table->IsDefaultDisplayOrder = false;
      }
      pIVar18 = (table->Columns).Data + (char)bVar13;
      if (table->DeclColumnsCount <= (char)bVar13) {
        TableSetupColumnFlags(table,pIVar18,0);
        pIVar18->NameOffset = -1;
        pIVar18->UserID = 0;
        pIVar18->InitStretchWeightOrWidth = -1.0;
      }
      uVar10 = table->Flags;
      if (((uVar10 & 4) == 0) || ((pIVar18->Flags & 0x80) != 0)) {
        pIVar18->IsUserEnabledNextFrame = true;
      }
      if (pIVar18->IsUserEnabled != pIVar18->IsUserEnabledNextFrame) {
        pIVar18->IsUserEnabled = pIVar18->IsUserEnabledNextFrame;
        table->IsSettingsDirty = true;
      }
      uVar5 = pIVar18->Flags;
      bVar12 = (bool)((uVar5 & 1) == 0 & pIVar18->IsUserEnabled);
      pIVar18->IsEnabled = bVar12;
      cVar3 = pIVar18->SortOrder;
      if ((cVar3 != -1) && (bVar12 == false)) {
        table->IsSortSpecsDirty = true;
      }
      if (((uVar10 >> 0x1a & 1) == 0) && ('\0' < cVar3)) {
        table->IsSortSpecsDirty = true;
      }
      if ((&pIVar18->WidthRequest)[(ulong)((uVar5 & 0x10) == 0) * 2] <= 0.0 &&
          (&pIVar18->WidthRequest)[(ulong)((uVar5 & 0x10) == 0) * 2] != 0.0) {
        pIVar18->AutoFitQueue = '\a';
        pIVar18->CannotSkipItemsQueue = '\a';
      }
      if (bVar12 == false) {
        pIVar18->IndexWithinEnabledSet = -1;
        uVar11 = uVar14;
      }
      else {
        pIVar18->PrevEnabledColumn = (ImGuiTableColumnIdx)uVar14;
        pIVar18->NextEnabledColumn = -1;
        if ((int)uVar14 == -1) {
          table->LeftMostEnabledColumn = bVar13;
        }
        else {
          (table->Columns).Data[(int)uVar14].NextEnabledColumn = bVar13;
        }
        cVar3 = table->ColumnsEnabledCount;
        table->ColumnsEnabledCount = cVar3 + '\x01';
        pIVar18->IndexWithinEnabledSet = cVar3;
        table->EnabledMaskByIndex = table->EnabledMaskByIndex | 1L << (bVar13 & 0x3f);
        table->EnabledMaskByDisplayOrder =
             table->EnabledMaskByDisplayOrder | 1L << (pIVar18->DisplayOrder & 0x3fU);
        if (pIVar18->IsPreserveWidthAuto == false) {
          fVar23 = TableGetColumnWidthAuto(table,pIVar18);
          pIVar18->WidthAuto = fVar23;
        }
        if ((uVar5 & 0x20) == 0) {
          bVar8 = true;
        }
        if (((uVar5 & 0x10) != 0) &&
           (0.0 < pIVar18->InitStretchWeightOrWidth && (uVar5 & 0x20) != 0)) {
          pIVar18->WidthAuto = pIVar18->InitStretchWeightOrWidth;
        }
        if (pIVar18->AutoFitQueue != '\0') {
          bVar9 = true;
        }
        fVar23 = pIVar18->WidthAuto;
        if ((uVar5 & 8) == 0) {
          fVar25 = (float)((uint)fVar25 & -(uint)(fVar23 <= fVar25) |
                          ~-(uint)(fVar23 <= fVar25) & (uint)fVar23);
          cVar16 = cVar16 + '\x01';
        }
        else {
          fVar26 = fVar26 + fVar23;
          iVar15 = iVar15 + 1;
        }
      }
      uVar20 = uVar20 + 1;
      uVar10 = table->ColumnsCount;
      uVar14 = uVar11;
    } while ((long)uVar20 < (long)(int)uVar10);
    fVar23 = (float)iVar15;
    bVar8 = !bVar8;
  }
  uVar5 = table->Flags;
  if ((((uVar5 & 8) != 0) && ((uVar5 >> 0x1b & 1) == 0)) && (table->SortSpecsCount == '\0')) {
    table->IsSortSpecsDirty = true;
  }
  table->RightMostEnabledColumn = (ImGuiTableColumnIdx)uVar11;
  if (bVar9) {
    if (table->OuterWindow != table->InnerWindow) {
      table->InnerWindow->SkipItems = false;
    }
    table->IsSettingsDirty = true;
  }
  table->LeftMostStretchedColumn = -1;
  table->RightMostStretchedColumn = -1;
  if ((int)uVar10 < 1) {
    fVar24 = 0.0;
    fVar27 = 0.0;
  }
  else {
    uVar11 = table->EnabledMaskByIndex;
    lVar17 = 99;
    uVar14 = 0;
    fVar27 = 0.0;
    fVar24 = 0.0;
    do {
      bVar13 = (byte)uVar14;
      if ((uVar11 >> (uVar14 & 0x3f) & 1) != 0) {
        pIVar18 = (table->Columns).Data;
        uVar22 = *(uint *)((long)pIVar18 + lVar17 + -99);
        if ((uVar22 & 0x10) == 0) {
          if ((((uVar22 & 0x20) != 0) || (*(char *)((long)&pIVar18->Flags + lVar17) != '\0')) ||
             (pfVar2 = (float *)((long)pIVar18 + lVar17 + -0x4b), *pfVar2 <= 0.0 && *pfVar2 != 0.0))
          {
            fVar28 = *(float *)((long)pIVar18 + lVar17 + -0x47);
            bVar9 = fVar28 <= 0.0;
            if (fVar28 <= 0.0) {
              fVar28 = 1.0;
            }
            if (bVar9 && uVar19 == 0x6000) {
              fVar28 = (*(float *)((long)pIVar18 + lVar17 + -0x4f) / fVar26) * fVar23;
            }
            *(float *)((long)pIVar18 + lVar17 + -0x4b) = fVar28;
          }
          fVar24 = fVar24 + *(float *)((long)pIVar18 + lVar17 + -0x4b);
          if (((long)table->LeftMostStretchedColumn == -1) ||
             (*(char *)((long)pIVar18 + lVar17 + -0x11) <
              pIVar18[table->LeftMostStretchedColumn].DisplayOrder)) {
            table->LeftMostStretchedColumn = bVar13;
          }
          if (((long)table->RightMostStretchedColumn == -1) ||
             (pIVar18[table->RightMostStretchedColumn].DisplayOrder <
              *(char *)((long)pIVar18 + lVar17 + -0x11))) {
            table->RightMostStretchedColumn = bVar13;
          }
        }
        else {
          fVar28 = *(float *)((long)pIVar18 + lVar17 + -0x4f);
          if ((uVar19 == 0x4000) &&
             (((uVar22 & 0x20) != 0 || (*(char *)((long)&pIVar18->Flags + lVar17) != '\0')))) {
            fVar28 = fVar25;
          }
          bVar4 = *(byte *)((long)&pIVar18->Flags + lVar17);
          if ((bVar4 != 0) ||
             (((uVar22 & 0x20) != 0 &&
              ((table->RequestOutputMaskByIndex & 1L << (bVar13 & 0x3f)) != 0)))) {
            *(float *)((long)pIVar18 + lVar17 + -0x53) = fVar28;
          }
          if (((1 < bVar4) && (table->IsInitializing == true)) &&
             (*(char *)((long)pIVar18 + lVar17 + -2) == '\0')) {
            fVar28 = *(float *)((long)pIVar18 + lVar17 + -0x53);
            fVar30 = table->MinColumnWidth * 4.0;
            uVar22 = -(uint)(fVar30 <= fVar28);
            *(uint *)((long)pIVar18 + lVar17 + -0x53) =
                 ~uVar22 & (uint)fVar30 | (uint)fVar28 & uVar22;
          }
          fVar27 = fVar27 + *(float *)((long)pIVar18 + lVar17 + -0x53);
        }
        *(undefined1 *)((long)pIVar18 + lVar17 + -2) = 0;
        fVar27 = fVar27 + table->CellPaddingX + table->CellPaddingX;
      }
      uVar14 = uVar14 + 1;
      lVar17 = lVar17 + 0x68;
    } while (uVar10 != uVar14);
  }
  table->ColumnsEnabledFixedCount = cVar16;
  fVar25 = (table->WorkRect).Min.x;
  fVar26 = table->OuterPaddingX + table->OuterPaddingX +
           (float)(table->ColumnsEnabledCount + -1) * (table->CellSpacingX1 + table->CellSpacingX2);
  if ((((uVar5 >> 0x18 & 1) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth))) {
    fVar23 = (table->WorkRect).Max.x - fVar25;
  }
  else {
    fVar23 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  fVar28 = (table->WorkRect).Min.y;
  fVar27 = (fVar23 - fVar26) - fVar27;
  table->ColumnsGivenWidth =
       (float)(int)table->ColumnsEnabledCount * (table->CellPaddingX + table->CellPaddingX) + fVar26
  ;
  fVar26 = fVar27;
  if (0 < (int)uVar10) {
    uVar11 = table->EnabledMaskByIndex;
    lVar17 = 0x55;
    uVar14 = 0;
    do {
      if ((uVar11 >> (uVar14 & 0x3f) & 1) != 0) {
        pIVar18 = (table->Columns).Data;
        uVar19 = *(uint *)((long)pIVar18 + lVar17 + -0x55);
        if ((uVar19 & 8) != 0) {
          fVar23 = (*(float *)((long)pIVar18 + lVar17 + -0x3d) / fVar24) * fVar27;
          uVar22 = -(uint)(table->MinColumnWidth <= fVar23);
          fVar23 = (float)(int)((float)(~uVar22 & (uint)table->MinColumnWidth |
                                       (uint)fVar23 & uVar22) + 0.01);
          *(float *)((long)pIVar18 + lVar17 + -0x45) = fVar23;
          fVar26 = fVar26 - fVar23;
        }
        if ((*(char *)((long)&pIVar18->Flags + lVar17) == -1) &&
           (table->LeftMostStretchedColumn != -1)) {
          *(uint *)((long)pIVar18 + lVar17 + -0x55) = uVar19 | 0x40000000;
        }
        fVar23 = *(float *)((long)pIVar18 + lVar17 + -0x45);
        uVar19 = -(uint)(table->MinColumnWidth <= fVar23);
        fVar23 = (float)(int)(float)(~uVar19 & (uint)table->MinColumnWidth | (uint)fVar23 & uVar19);
        *(float *)((long)pIVar18 + lVar17 + -0x51) = fVar23;
        table->ColumnsGivenWidth = fVar23 + table->ColumnsGivenWidth;
      }
      uVar14 = uVar14 + 1;
      lVar17 = lVar17 + 0x68;
    } while (uVar10 != uVar14);
  }
  if ((((uVar5 >> 0x13 & 1) == 0) && (1.0 <= fVar26)) &&
     ((1.0 <= fVar26 && ((0 < (int)uVar10 && (0.0 < fVar24)))))) {
    uVar11 = table->EnabledMaskByDisplayOrder;
    uVar14 = (ulong)uVar10;
    do {
      if ((uVar11 >> ((ulong)((int)uVar14 - 1U & 0xff) & 0x3f) & 1) != 0) {
        pIVar18 = (table->Columns).Data;
        cVar16 = (table->DisplayOrderToIndex).Data[uVar14 - 1];
        if ((pIVar18[cVar16].Flags & 8) != 0) {
          pIVar18[cVar16].WidthRequest = pIVar18[cVar16].WidthRequest + 1.0;
          pIVar18[cVar16].WidthGiven = pIVar18[cVar16].WidthGiven + 1.0;
          fVar26 = fVar26 + -1.0;
        }
      }
    } while (((0.0 < fVar24) && (1.0 <= fVar26)) &&
            (bVar9 = 1 < (long)uVar14, uVar14 = uVar14 - 1, bVar9));
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  local_40.Max.x = (table->OuterRect).Max.x;
  fVar26 = (table->OuterRect).Max.y;
  local_40.Min = (table->OuterRect).Min;
  fVar23 = local_40.Min.y + table->LastOuterHeight;
  uVar19 = -(uint)(fVar23 <= fVar26);
  local_40.Max.y = (float)(uVar19 & (uint)fVar26 | ~uVar19 & (uint)fVar23);
  bVar12 = ItemHoverable(&local_40,0);
  bVar9 = '\0' < table->FreezeColumnsCount;
  fVar26 = fVar25;
  if ('\0' < table->FreezeColumnsCount) {
    fVar26 = (table->OuterRect).Min.x;
  }
  local_58.Min = (table->InnerClipRect).Min;
  local_58.Max = (table->InnerClipRect).Max;
  table->VisibleMaskByIndex = 0;
  table->RequestOutputMaskByIndex = 0;
  uVar11 = (ulong)(uint)table->ColumnsCount;
  if (0 < table->ColumnsCount) {
    fVar26 = (fVar26 + table->OuterPaddingX) - table->CellSpacingX1;
    uVar14 = 0;
    iVar15 = 0;
    do {
      bVar13 = (table->DisplayOrderToIndex).Data[uVar14];
      bVar21 = true;
      if (table->FreezeRowsCount < '\x01') {
        bVar21 = (char)bVar13 < table->FreezeColumnsCount;
      }
      pIVar18 = (table->Columns).Data + (char)bVar13;
      pIVar18->NavLayerCurrent = bVar21;
      if ((bVar9) && (iVar15 == table->FreezeColumnsCount)) {
        fVar26 = fVar26 + (fVar25 - (table->OuterRect).Min.x);
        bVar9 = false;
      }
      pbVar1 = (byte *)((long)&pIVar18->Flags + 3);
      *pbVar1 = *pbVar1 & 0xf0;
      if ((table->EnabledMaskByDisplayOrder >> (uVar14 & 0x3f) & 1) == 0) {
        (pIVar18->ClipRect).Max.x = fVar26;
        (pIVar18->ClipRect).Min.x = fVar26;
        pIVar18->WorkMinX = fVar26;
        pIVar18->MaxX = fVar26;
        pIVar18->MinX = fVar26;
        pIVar18->WidthGiven = 0.0;
        (pIVar18->ClipRect).Min.y = fVar28;
        (pIVar18->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar18->ClipRect,&local_58);
        pIVar18->IsVisibleX = false;
        pIVar18->IsVisibleY = false;
        pIVar18->IsRequestOutput = false;
        pIVar18->IsSkipItems = true;
        pIVar18->ItemWidth = 1.0;
      }
      else {
        if (((bVar12) && (fVar23 = (local_48->IO).MousePos.x, (pIVar18->ClipRect).Min.x <= fVar23))
           && (fVar23 < (pIVar18->ClipRect).Max.x)) {
          table->HoveredColumnBody = bVar13;
        }
        pIVar18->MinX = fVar26;
        fVar24 = TableGetMaxColumnWidth(table,(int)(char)bVar13);
        fVar23 = pIVar18->WidthGiven;
        if (fVar24 <= pIVar18->WidthGiven) {
          fVar23 = fVar24;
        }
        pIVar18->WidthGiven = fVar23;
        fVar24 = pIVar18->WidthRequest;
        if (table->MinColumnWidth <= pIVar18->WidthRequest) {
          fVar24 = table->MinColumnWidth;
        }
        fVar30 = (float)(~-(uint)(fVar24 <= fVar23) & (uint)fVar24 |
                        (uint)fVar23 & -(uint)(fVar24 <= fVar23));
        pIVar18->WidthGiven = fVar30;
        fVar23 = table->CellPaddingX;
        fVar24 = table->CellSpacingX1;
        fVar27 = table->CellSpacingX2;
        fVar29 = fVar23 + fVar23 + fVar30 + fVar26 + fVar24 + fVar27;
        pIVar18->MaxX = fVar29;
        pIVar18->WorkMinX = fVar26 + fVar23 + fVar24;
        pIVar18->WorkMaxX = (fVar29 - fVar23) - fVar27;
        pIVar18->ItemWidth = (float)(int)(fVar30 * 0.65);
        (pIVar18->ClipRect).Min.x = fVar26;
        (pIVar18->ClipRect).Min.y = fVar28;
        (pIVar18->ClipRect).Max.x = fVar29;
        (pIVar18->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar18->ClipRect,&local_58);
        fVar23 = (pIVar18->ClipRect).Min.x;
        fVar24 = (pIVar18->ClipRect).Max.x;
        pIVar18->IsVisibleX = fVar23 < fVar24;
        pIVar18->IsVisibleY = true;
        if (fVar24 <= fVar23) {
          if (pIVar18->AutoFitQueue != '\0') goto LAB_0013a622;
          bVar21 = pIVar18->CannotSkipItemsQueue != '\0';
          pIVar18->IsRequestOutput = bVar21;
          if (bVar21) goto LAB_0013a62e;
        }
        else {
          table->VisibleMaskByIndex = table->VisibleMaskByIndex | 1L << (bVar13 & 0x3f);
LAB_0013a622:
          pIVar18->IsRequestOutput = true;
LAB_0013a62e:
          table->RequestOutputMaskByIndex = table->RequestOutputMaskByIndex | 1L << (bVar13 & 0x3f);
        }
        bVar21 = true;
        if (pIVar18->IsEnabled == true) {
          bVar21 = table->HostSkipItems;
        }
        pIVar18->IsSkipItems = bVar21;
        uVar19 = (uint)(fVar23 < fVar24) << 0x19 | pIVar18->Flags;
        pIVar18->Flags = uVar19 | 0x1000000;
        if (pIVar18->SortOrder != -1) {
          pIVar18->Flags = uVar19 | 0x5000000;
        }
        if (table->HoveredColumnBody == bVar13) {
          pbVar1 = (byte *)((long)&pIVar18->Flags + 3);
          *pbVar1 = *pbVar1 | 8;
        }
        fVar23 = pIVar18->WorkMinX;
        pIVar18->ContentMaxXFrozen = fVar23;
        pIVar18->ContentMaxXUnfrozen = fVar23;
        pIVar18->ContentMaxXHeadersUsed = fVar23;
        pIVar18->ContentMaxXHeadersIdeal = fVar23;
        if (table->HostSkipItems == false) {
          pIVar18->AutoFitQueue = pIVar18->AutoFitQueue >> 1;
          pIVar18->CannotSkipItemsQueue = pIVar18->CannotSkipItemsQueue >> 1;
        }
        if (iVar15 < table->FreezeColumnsCount) {
          fVar24 = pIVar18->MaxX + 1.0;
          fVar23 = local_58.Max.x;
          if (fVar24 <= local_58.Max.x) {
            fVar23 = fVar24;
          }
          local_58.Min.x =
               (float)(-(uint)(fVar24 < local_58.Min.x) & (uint)local_58.Min.x |
                      ~-(uint)(fVar24 < local_58.Min.x) & (uint)fVar23);
        }
        fVar26 = fVar26 + table->CellPaddingX + table->CellPaddingX +
                          pIVar18->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2;
        iVar15 = iVar15 + 1;
      }
      uVar14 = uVar14 + 1;
      uVar11 = (ulong)table->ColumnsCount;
    } while ((long)uVar14 < (long)uVar11);
  }
  fVar25 = (table->WorkRect).Min.x;
  fVar26 = (table->Columns).Data[table->RightMostEnabledColumn].ClipRect.Max.x;
  uVar19 = -(uint)(fVar26 <= fVar25);
  fVar25 = (float)(uVar19 & (uint)fVar25 | ~uVar19 & (uint)fVar26);
  if (((bVar12) && (table->HoveredColumnBody == -1)) && (fVar25 <= (local_48->IO).MousePos.x)) {
    table->HoveredColumnBody = (ImGuiTableColumnIdx)uVar11;
  }
  if ((bVar8) && ((table->Flags & 1U) != 0)) {
    table->Flags = table->Flags & 0xfffffffe;
  }
  if (table->RightMostStretchedColumn != -1) {
    pbVar1 = (byte *)((long)&table->Flags + 2);
    *pbVar1 = *pbVar1 & 0xfe;
  }
  if ((table->Flags & 0x10000) != 0) {
    (table->WorkRect).Max.x = fVar25;
    (table->OuterRect).Max.x = fVar25;
    fVar26 = (table->InnerClipRect).Max.x;
    if (fVar25 <= fVar26) {
      fVar26 = fVar25;
    }
    (table->InnerClipRect).Max.x = fVar26;
  }
  pIVar6 = table->InnerWindow;
  IVar7 = (table->WorkRect).Max;
  (pIVar6->ParentWorkRect).Min = (table->WorkRect).Min;
  (pIVar6->ParentWorkRect).Max = IVar7;
  fVar25 = (table->InnerClipRect).Max.x;
  table->BorderX1 = (table->InnerClipRect).Min.x;
  table->BorderX2 = fVar25;
  TableSetupDrawChannels(table);
  if ((table->Flags & 1) != 0) {
    TableUpdateBorders(table);
  }
  table->LastFirstRowHeight = 0.0;
  table->IsLayoutLocked = true;
  table->IsUsingHeaders = false;
  if ((table->IsContextPopupOpen == true) && (table->InstanceCurrent == table->InstanceInteracted))
  {
    id = ImHashStr("##ContextMenu",0,table->ID);
    bVar9 = BeginPopupEx(id,0x141);
    if (bVar9) {
      TableDrawContextMenu(table);
      EndPopup();
    }
    else {
      table->IsContextPopupOpen = false;
    }
  }
  if ((table->IsSortSpecsDirty == true) && ((table->Flags & 8) != 0)) {
    TableSortSpecsBuild(table);
  }
  pIVar6 = table->InnerWindow;
  if ((table->Flags & 0x100000) == 0) {
    ImDrawList::PushClipRect(pIVar6->DrawList,(pIVar6->ClipRect).Min,(pIVar6->ClipRect).Max,false);
  }
  else {
    ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,pIVar6->DrawList,2);
  }
  return;
}

Assistant:

void ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
    table->IsDefaultDisplayOrder = true;
    table->ColumnsEnabledCount = 0;
    table->EnabledMaskByIndex = 0x00;
    table->EnabledMaskByDisplayOrder = 0x00;
    table->LeftMostEnabledColumn = -1;
    table->MinColumnWidth = ImMax(1.0f, g.Style.FramePadding.x * 1.0f); // g.Style.ColumnsMinSpacing; // FIXME-TABLE

    // [Part 1] Apply/lock Enabled and Order states. Calculate auto/ideal width for columns. Count fixed/stretch columns.
    // Process columns in their visible orders as we are building the Prev/Next indices.
    int count_fixed = 0;                // Number of columns that have fixed sizing policies
    int count_stretch = 0;              // Number of columns that have stretch sizing policies
    int prev_visible_column_idx = -1;
    bool has_auto_fit_request = false;
    bool has_resizable = false;
    float stretch_sum_width_auto = 0.0f;
    float fixed_max_width_auto = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        if (column_n != order_n)
            table->IsDefaultDisplayOrder = false;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Clear column setup if not submitted by user. Currently we make it mandatory to call TableSetupColumn() every frame.
        // It would easily work without but we're not ready to guarantee it since e.g. names need resubmission anyway.
        // We take a slight shortcut but in theory we could be calling TableSetupColumn() here with dummy values, it should yield the same effect.
        if (table->DeclColumnsCount <= column_n)
        {
            TableSetupColumnFlags(table, column, ImGuiTableColumnFlags_None);
            column->NameOffset = -1;
            column->UserID = 0;
            column->InitStretchWeightOrWidth = -1.0f;
        }

        // Update Enabled state, mark settings and sort specs dirty
        if (!(table->Flags & ImGuiTableFlags_Hideable) || (column->Flags & ImGuiTableColumnFlags_NoHide))
            column->IsUserEnabledNextFrame = true;
        if (column->IsUserEnabled != column->IsUserEnabledNextFrame)
        {
            column->IsUserEnabled = column->IsUserEnabledNextFrame;
            table->IsSettingsDirty = true;
        }
        column->IsEnabled = column->IsUserEnabled && (column->Flags & ImGuiTableColumnFlags_Disabled) == 0;

        if (column->SortOrder != -1 && !column->IsEnabled)
            table->IsSortSpecsDirty = true;
        if (column->SortOrder > 0 && !(table->Flags & ImGuiTableFlags_SortMulti))
            table->IsSortSpecsDirty = true;

        // Auto-fit unsized columns
        const bool start_auto_fit = (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? (column->WidthRequest < 0.0f) : (column->StretchWeight < 0.0f);
        if (start_auto_fit)
            column->AutoFitQueue = column->CannotSkipItemsQueue = (1 << 3) - 1; // Fit for three frames

        if (!column->IsEnabled)
        {
            column->IndexWithinEnabledSet = -1;
            continue;
        }

        // Mark as enabled and link to previous/next enabled column
        column->PrevEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
        column->NextEnabledColumn = -1;
        if (prev_visible_column_idx != -1)
            table->Columns[prev_visible_column_idx].NextEnabledColumn = (ImGuiTableColumnIdx)column_n;
        else
            table->LeftMostEnabledColumn = (ImGuiTableColumnIdx)column_n;
        column->IndexWithinEnabledSet = table->ColumnsEnabledCount++;
        table->EnabledMaskByIndex |= (ImU64)1 << column_n;
        table->EnabledMaskByDisplayOrder |= (ImU64)1 << column->DisplayOrder;
        prev_visible_column_idx = column_n;
        IM_ASSERT(column->IndexWithinEnabledSet <= column->DisplayOrder);

        // Calculate ideal/auto column width (that's the width required for all contents to be visible without clipping)
        // Combine width from regular rows + width from headers unless requested not to.
        if (!column->IsPreserveWidthAuto)
            column->WidthAuto = TableGetColumnWidthAuto(table, column);

        // Non-resizable columns keep their requested width (apply user value regardless of IsPreserveWidthAuto)
        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column_is_resizable)
            has_resizable = true;
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f && !column_is_resizable)
            column->WidthAuto = column->InitStretchWeightOrWidth;

        if (column->AutoFitQueue != 0x00)
            has_auto_fit_request = true;
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            stretch_sum_width_auto += column->WidthAuto;
            count_stretch++;
        }
        else
        {
            fixed_max_width_auto = ImMax(fixed_max_width_auto, column->WidthAuto);
            count_fixed++;
        }
    }
    if ((table->Flags & ImGuiTableFlags_Sortable) && table->SortSpecsCount == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        table->IsSortSpecsDirty = true;
    table->RightMostEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
    IM_ASSERT(table->LeftMostEnabledColumn >= 0 && table->RightMostEnabledColumn >= 0);

    // [Part 2] Disable child window clipping while fitting columns. This is not strictly necessary but makes it possible
    // to avoid the column fitting having to wait until the first visible frame of the child container (may or not be a good thing).
    // FIXME-TABLE: for always auto-resizing columns may not want to do that all the time.
    if (has_auto_fit_request && table->OuterWindow != table->InnerWindow)
        table->InnerWindow->SkipItems = false;
    if (has_auto_fit_request)
        table->IsSettingsDirty = true;

    // [Part 3] Fix column flags and record a few extra information.
    float sum_width_requests = 0.0f;        // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns but including spacing/padding.
    float stretch_sum_weights = 0.0f;       // Sum of all weights for stretch columns.
    table->LeftMostStretchedColumn = table->RightMostStretchedColumn = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
        {
            // Apply same widths policy
            float width_auto = column->WidthAuto;
            if (table_sizing_policy == ImGuiTableFlags_SizingFixedSame && (column->AutoFitQueue != 0x00 || !column_is_resizable))
                width_auto = fixed_max_width_auto;

            // Apply automatic width
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if (column->AutoFitQueue != 0x00)
                column->WidthRequest = width_auto;
            else if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !column_is_resizable && (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            // FIXME: This break IsPreserveWidthAuto from not flickering if the stored WidthAuto was smaller.
            if (column->AutoFitQueue > 0x01 && table->IsInitializing && !column->IsPreserveWidthAuto)
                column->WidthRequest = ImMax(column->WidthRequest, table->MinColumnWidth * 4.0f); // FIXME-TABLE: Another constant/scale?
            sum_width_requests += column->WidthRequest;
        }
        else
        {
            // Initialize stretch weight
            if (column->AutoFitQueue != 0x00 || column->StretchWeight < 0.0f || !column_is_resizable)
            {
                if (column->InitStretchWeightOrWidth > 0.0f)
                    column->StretchWeight = column->InitStretchWeightOrWidth;
                else if (table_sizing_policy == ImGuiTableFlags_SizingStretchProp)
                    column->StretchWeight = (column->WidthAuto / stretch_sum_width_auto) * count_stretch;
                else
                    column->StretchWeight = 1.0f;
            }

            stretch_sum_weights += column->StretchWeight;
            if (table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
            if (table->RightMostStretchedColumn == -1 || table->Columns[table->RightMostStretchedColumn].DisplayOrder < column->DisplayOrder)
                table->RightMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
        }
        column->IsPreserveWidthAuto = false;
        sum_width_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsEnabledFixedCount = (ImGuiTableColumnIdx)count_fixed;

    // [Part 4] Apply final widths based on requested widths
    const ImRect work_rect = table->WorkRect;
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = width_avail - width_spacings - sum_width_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;
    table->ColumnsGivenWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Allocate width for stretched/weighted columns (StretchWeight gets converted into WidthRequest)
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            float weight_ratio = column->StretchWeight / stretch_sum_weights;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, table->MinColumnWidth) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // See additional comments in TableSetColumnWidth().
        if (column->NextEnabledColumn == -1 && table->LeftMostStretchedColumn != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, table->MinColumnWidth));
        table->ColumnsGivenWidth += column->WidthGiven;
    }

    // [Part 5] Redistribute stretch remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor).
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; stretch_sum_weights > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // [Part 6] Setup final position, offset, skip/clip states and clipping rectangles, detect hovered column
    // Process columns in their visible orders as we are comparing the visible order and adjusting host_clip_rect while looping.
    int visible_n = 0;
    bool offset_x_frozen = (table->FreezeColumnsCount > 0);
    float offset_x = ((table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x) + table->OuterPaddingX - table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    table->VisibleMaskByIndex = 0x00;
    table->RequestOutputMaskByIndex = 0x00;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (offset_x_frozen && table->FreezeColumnsCount == visible_n)
        {
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;
            offset_x_frozen = false;
        }

        // Clear status flags
        column->Flags &= ~ImGuiTableColumnFlags_StatusMask_;

        if ((table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsVisibleX = column->IsVisibleY = column->IsRequestOutput = false;
            column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)column_n;

        // Lock start position
        column->MinX = offset_x;

        // Lock width based on start position and minimum/maximum width for this position
        float max_width = TableGetMaxColumnWidth(table, column_n);
        column->WidthGiven = ImMin(column->WidthGiven, max_width);
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, table->MinColumnWidth));
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;

        // Lock other positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) makes things more consistent when resizing down, tho slightly detrimental to visibility in very-small column.
        // - ClipRect.Max.x: using MaxX makes it easier for header to receive hover highlight with no discontinuity and display sorting arrow.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; //column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        // Mark column as Clipped (not in sight)
        // Note that scrolling tables (where inner_window != outer_window) handle Y clipped earlier in BeginTable() so IsVisibleY really only applies to non-scrolling tables.
        // FIXME-TABLE: Because InnerClipRect.Max.y is conservatively ==outer_window->ClipRect.Max.y, we never can mark columns _Above_ the scroll line as not IsVisibleY.
        // Taking advantage of LastOuterHeight would yield good results there...
        // FIXME-TABLE: Y clipping is disabled because it effectively means not submitting will reduce contents width which is fed to outer_window->DC.CursorMaxPos.x,
        // and this may be used (e.g. typically by outer_window using AlwaysAutoResize or outer_window's horizontal scrollbar, but could be something else).
        // Possible solution to preserve last known content width for clipped column. Test 'table_reported_size' fails when enabling Y clipping and window is resized small.
        column->IsVisibleX = (column->ClipRect.Max.x > column->ClipRect.Min.x);
        column->IsVisibleY = true; // (column->ClipRect.Max.y > column->ClipRect.Min.y);
        const bool is_visible = column->IsVisibleX; //&& column->IsVisibleY;
        if (is_visible)
            table->VisibleMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as requesting output from user. Note that fixed + non-resizable sets are auto-fitting at all times and therefore always request output.
        column->IsRequestOutput = is_visible || column->AutoFitQueue != 0 || column->CannotSkipItemsQueue != 0;
        if (column->IsRequestOutput)
            table->RequestOutputMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as SkipItems (ignoring all items/layout)
        column->IsSkipItems = !column->IsEnabled || table->HostSkipItems;
        if (column->IsSkipItems)
            IM_ASSERT(!is_visible);

        // Update status flags
        column->Flags |= ImGuiTableColumnFlags_IsEnabled;
        if (is_visible)
            column->Flags |= ImGuiTableColumnFlags_IsVisible;
        if (column->SortOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_IsSorted;
        if (table->HoveredColumnBody == column_n)
            column->Flags |= ImGuiTableColumnFlags_IsHovered;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImClamp(column->MaxX + TABLE_BORDER_SIZE, host_clip_rect.Min.x, host_clip_rect.Max.x);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // [Part 7] Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag, either
    // because of using _WidthAuto/_WidthStretch). This will hide the resizing option from the context menu.
    const float unused_x1 = ImMax(table->WorkRect.Min.x, table->Columns[table->RightMostEnabledColumn].ClipRect.Max.x);
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
    }
    if (has_resizable == false && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // [Part 8] Lock actual OuterRect/WorkRect right-most position.
    // This is done late to handle the case of fixed-columns tables not claiming more widths that they need.
    // Because of this we are careful with uses of WorkRect and InnerClipRect before this point.
    if (table->RightMostStretchedColumn != -1)
        table->Flags &= ~ImGuiTableFlags_NoHostExtendX;
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        table->OuterRect.Max.x = table->WorkRect.Max.x = unused_x1;
        table->InnerClipRect.Max.x = ImMin(table->InnerClipRect.Max.x, unused_x1);
    }
    table->InnerWindow->ParentWorkRect = table->WorkRect;
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // [Part 9] Allocate draw channels and setup background cliprect
    TableSetupDrawChannels(table);

    // [Part 10] Hit testing on borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // [Part 11] Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // [Part 13] Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter->SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_NOCLIP);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);
}